

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::TryMatchCharInst::Exec
          (TryMatchCharInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint64 *puVar1;
  CharCount CVar2;
  Label LVar3;
  uint uVar4;
  PageAllocation *pPVar5;
  code *pcVar6;
  bool bVar7;
  size_t sVar8;
  undefined4 *puVar9;
  Program *pPVar10;
  uchar *puVar11;
  
  if (matcher->stats != (Type)0x0) {
    puVar1 = &matcher->stats->numCompares;
    *puVar1 = *puVar1 + 1;
  }
  if ((*inputOffset < inputLength) && (input[*inputOffset] == (this->super_CharMixin).c)) {
    sVar8 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
            super_ContinuousPageStack<1UL>.bufferSize;
    if (sVar8 - (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                super_ContinuousPageStack<1UL>.nextTop < 0x20) {
      ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x20);
      sVar8 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
              super_ContinuousPageStack<1UL>.bufferSize;
    }
    if (sVar8 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,199,"(bufferSize)","bufferSize");
      if (!bVar7) {
LAB_00efb549:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar9 = 0;
    }
    pPVar5 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.pageAllocation;
    sVar8 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
            super_ContinuousPageStack<1UL>.nextTop;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
    super_ContinuousPageStack<1UL>.nextTop = sVar8 + 0x20;
    *(size_t *)((long)&pPVar5[1].pageCount + sVar8) =
         (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
         topElementSize;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).topElementSize
         = 0x20;
    CVar2 = *inputOffset;
    LVar3 = (this->super_TryMixin).failLabel;
    *(undefined1 *)((long)&pPVar5[2].pageCount + sVar8) = 0;
    *(undefined ***)((long)&pPVar5[1].segment + sVar8) = &PTR_Print_015432a8;
    *(CharCount *)((long)&pPVar5[2].pageCount + sVar8 + 4) = CVar2;
    *(Label *)((long)&pPVar5[2].segment + sVar8) = LVar3;
    Matcher::PushStats(matcher,contStack,input);
    *inputOffset = *inputOffset + 1;
    puVar11 = *instPointer + 7;
  }
  else {
    uVar4 = (this->super_TryMixin).failLabel;
    pPVar10 = (matcher->program).ptr;
    if ((pPVar10->rep).insts.instsLen <= uVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                         ,0x76d,"(label < program->rep.insts.instsLen)",
                         "label < program->rep.insts.instsLen");
      if (!bVar7) goto LAB_00efb549;
      *puVar9 = 0;
      pPVar10 = (matcher->program).ptr;
    }
    puVar11 = (pPVar10->rep).insts.insts.ptr + uVar4;
  }
  *instPointer = puVar11;
  return false;
}

Assistant:

inline bool TryMatchCharInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if (inputOffset < inputLength && input[inputOffset] == c)
        {
            // CHOICEPOINT: Resume at fail label on backtrack
            PUSH(contStack, ResumeCont, inputOffset, failLabel);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
            inputOffset++;
            instPointer += sizeof(*this);
            return false;
        }

        // Proceed directly to exit
        instPointer = matcher.LabelToInstPointer(failLabel);
        return false;
    }